

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O0

void __thiscall XPMP2::CSLModel::DecRefCnt(CSLModel *this)

{
  int iVar1;
  undefined8 uVar2;
  long in_RDI;
  float fVar3;
  
  if (*(int *)(in_RDI + 0xfc) == 0) {
    if (glob < 3) {
      uVar2 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLModels.cpp"
             ,0x1ef,"DecRefCnt",logWARN,"Reference counter already 0, can\'t be decreaed, for %s",
             uVar2);
    }
  }
  else {
    iVar1 = *(int *)(in_RDI + 0xfc) + -1;
    *(int *)(in_RDI + 0xfc) = iVar1;
    if (iVar1 == 0) {
      fVar3 = GetMiscNetwTime();
      *(float *)(in_RDI + 0x100) = fVar3;
    }
  }
  return;
}

Assistant:

void CSLModel::DecRefCnt ()
 {
     if (refCnt>0) {
         if (--refCnt == 0) {
             // reached zero...remember when for later garbage collection
             refZeroTs = GetMiscNetwTime();
         }
     } else {
         LOG_MSG(logWARN, WARN_REF_CNT_ZERO, cslId.c_str());
     }
 }